

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O3

size_t countTags(TestStream *input,uint64_t tagToCount)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  size_t sVar3;
  Range local_38;
  
  sVar1 = input->readPos;
  iVar2 = (*(input->super_EntryStream)._vptr_EntryStream[2])();
  local_38._begin = (char *)CONCAT44(extraout_var,iVar2);
  sVar3 = 0;
  if ((uint64_t *)local_38._begin != extraout_RDX) {
    do {
      binlog::Range::throw_if_overflow(&local_38,8);
      sVar3 = sVar3 + (*(uint64_t *)local_38._begin == tagToCount);
      iVar2 = (*(input->super_EntryStream)._vptr_EntryStream[2])(input);
      local_38._begin = (char *)CONCAT44(extraout_var_00,iVar2);
    } while ((uint64_t *)local_38._begin != extraout_RDX_00);
  }
  input->readPos = sVar1;
  return sVar3;
}

Assistant:

std::size_t countTags(TestStream& input, std::uint64_t tagToCount)
{
  std::size_t result = 0;
  const std::size_t oldReadPos = input.readPos;

  while (binlog::Range payload = input.nextEntryPayload())
  {
    const std::uint64_t tag = payload.read<std::uint64_t>();
    if (tag == tagToCount) { ++result; }
  }

  input.readPos = oldReadPos;

  return result;
}